

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WindowBase.cpp
# Opt level: O0

bool __thiscall sf::WindowBase::pollEvent(WindowBase *this,Event *event)

{
  bool bVar1;
  undefined8 in_RSI;
  WindowBase *in_RDI;
  Event *in_stack_ffffffffffffffd8;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  if ((in_RDI->m_impl == (WindowImpl *)0x0) ||
     (bVar1 = priv::WindowImpl::popEvent
                        ((WindowImpl *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8)
                         ,(Event *)in_RDI,SUB81((ulong)in_RSI >> 0x38,0)), !bVar1)) {
    bVar1 = false;
  }
  else {
    bVar1 = filterEvent(in_RDI,in_stack_ffffffffffffffd8);
  }
  return bVar1;
}

Assistant:

bool WindowBase::pollEvent(Event& event)
{
    if (m_impl && m_impl->popEvent(event, false))
    {
        return filterEvent(event);
    }
    else
    {
        return false;
    }
}